

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O2

int * floor1_interpolate_fit(vorbis_block *vb,vorbis_look_floor1 *look,int *A,int *B,int del)

{
  int *piVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  
  if (B == (int *)0x0 || A == (int *)0x0) {
    piVar1 = (int *)0x0;
  }
  else {
    lVar4 = (long)look->posts;
    piVar1 = (int *)_vorbis_block_alloc(vb,lVar4 * 4);
    lVar2 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar2;
    }
    for (; lVar4 != lVar2; lVar2 = lVar2 + 1) {
      uVar3 = (int)((A[lVar2] & 0x7fffU) * (0x10000 - del) + (B[lVar2] & 0x7fffU) * del + 0x8000) >>
              0x10;
      piVar1[lVar2] = uVar3;
      if (((*(byte *)((long)A + lVar2 * 4 + 1) & 0x80) != 0) &&
         ((*(byte *)((long)B + lVar2 * 4 + 1) & 0x80) != 0)) {
        piVar1[lVar2] = uVar3 | 0x8000;
      }
    }
  }
  return piVar1;
}

Assistant:

int *floor1_interpolate_fit(vorbis_block *vb,vorbis_look_floor1 *look,
                          int *A,int *B,
                          int del){

  long i;
  long posts=look->posts;
  int *output=NULL;

  if(A && B){
    output=_vorbis_block_alloc(vb,sizeof(*output)*posts);

    /* overly simpleminded--- look again post 1.2 */
    for(i=0;i<posts;i++){
      output[i]=((65536-del)*(A[i]&0x7fff)+del*(B[i]&0x7fff)+32768)>>16;
      if(A[i]&0x8000 && B[i]&0x8000)output[i]|=0x8000;
    }
  }

  return(output);
}